

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

int setorientation(TIFFRGBAImage *img)

{
  TIFFRGBAImage *img_local;
  
  switch(img->orientation) {
  case 1:
  case 5:
    if ((img->req_orientation == 2) || (img->req_orientation == 6)) {
      img_local._4_4_ = 2;
    }
    else if ((img->req_orientation == 3) || (img->req_orientation == 7)) {
      img_local._4_4_ = 3;
    }
    else if ((img->req_orientation == 4) || (img->req_orientation == 8)) {
      img_local._4_4_ = 1;
    }
    else {
      img_local._4_4_ = 0;
    }
    break;
  case 2:
  case 6:
    if ((img->req_orientation == 1) || (img->req_orientation == 5)) {
      img_local._4_4_ = 2;
    }
    else if ((img->req_orientation == 3) || (img->req_orientation == 7)) {
      img_local._4_4_ = 1;
    }
    else if ((img->req_orientation == 4) || (img->req_orientation == 8)) {
      img_local._4_4_ = 3;
    }
    else {
      img_local._4_4_ = 0;
    }
    break;
  case 3:
  case 7:
    if ((img->req_orientation == 1) || (img->req_orientation == 5)) {
      img_local._4_4_ = 3;
    }
    else if ((img->req_orientation == 2) || (img->req_orientation == 6)) {
      img_local._4_4_ = 1;
    }
    else if ((img->req_orientation == 4) || (img->req_orientation == 8)) {
      img_local._4_4_ = 2;
    }
    else {
      img_local._4_4_ = 0;
    }
    break;
  case 4:
  case 8:
    if ((img->req_orientation == 1) || (img->req_orientation == 5)) {
      img_local._4_4_ = 1;
    }
    else if ((img->req_orientation == 2) || (img->req_orientation == 6)) {
      img_local._4_4_ = 3;
    }
    else if ((img->req_orientation == 3) || (img->req_orientation == 7)) {
      img_local._4_4_ = 2;
    }
    else {
      img_local._4_4_ = 0;
    }
    break;
  default:
    img_local._4_4_ = 0;
  }
  return img_local._4_4_;
}

Assistant:

static int setorientation(TIFFRGBAImage *img)
{
    switch (img->orientation)
    {
        case ORIENTATION_TOPLEFT:
        case ORIENTATION_LEFTTOP:
            if (img->req_orientation == ORIENTATION_TOPRIGHT ||
                img->req_orientation == ORIENTATION_RIGHTTOP)
                return FLIP_HORIZONTALLY;
            else if (img->req_orientation == ORIENTATION_BOTRIGHT ||
                     img->req_orientation == ORIENTATION_RIGHTBOT)
                return FLIP_HORIZONTALLY | FLIP_VERTICALLY;
            else if (img->req_orientation == ORIENTATION_BOTLEFT ||
                     img->req_orientation == ORIENTATION_LEFTBOT)
                return FLIP_VERTICALLY;
            else
                return 0;
        case ORIENTATION_TOPRIGHT:
        case ORIENTATION_RIGHTTOP:
            if (img->req_orientation == ORIENTATION_TOPLEFT ||
                img->req_orientation == ORIENTATION_LEFTTOP)
                return FLIP_HORIZONTALLY;
            else if (img->req_orientation == ORIENTATION_BOTRIGHT ||
                     img->req_orientation == ORIENTATION_RIGHTBOT)
                return FLIP_VERTICALLY;
            else if (img->req_orientation == ORIENTATION_BOTLEFT ||
                     img->req_orientation == ORIENTATION_LEFTBOT)
                return FLIP_HORIZONTALLY | FLIP_VERTICALLY;
            else
                return 0;
        case ORIENTATION_BOTRIGHT:
        case ORIENTATION_RIGHTBOT:
            if (img->req_orientation == ORIENTATION_TOPLEFT ||
                img->req_orientation == ORIENTATION_LEFTTOP)
                return FLIP_HORIZONTALLY | FLIP_VERTICALLY;
            else if (img->req_orientation == ORIENTATION_TOPRIGHT ||
                     img->req_orientation == ORIENTATION_RIGHTTOP)
                return FLIP_VERTICALLY;
            else if (img->req_orientation == ORIENTATION_BOTLEFT ||
                     img->req_orientation == ORIENTATION_LEFTBOT)
                return FLIP_HORIZONTALLY;
            else
                return 0;
        case ORIENTATION_BOTLEFT:
        case ORIENTATION_LEFTBOT:
            if (img->req_orientation == ORIENTATION_TOPLEFT ||
                img->req_orientation == ORIENTATION_LEFTTOP)
                return FLIP_VERTICALLY;
            else if (img->req_orientation == ORIENTATION_TOPRIGHT ||
                     img->req_orientation == ORIENTATION_RIGHTTOP)
                return FLIP_HORIZONTALLY | FLIP_VERTICALLY;
            else if (img->req_orientation == ORIENTATION_BOTRIGHT ||
                     img->req_orientation == ORIENTATION_RIGHTBOT)
                return FLIP_HORIZONTALLY;
            else
                return 0;
        default: /* NOTREACHED */
            return 0;
    }
}